

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O0

bool __thiscall
UnixMakefileGenerator::writeObjectsPart
          (UnixMakefileGenerator *this,QTextStream *t,bool do_incremental)

{
  bool bVar1;
  bool bVar2;
  QList<ProString> *this_00;
  const_iterator cVar3;
  ProString *str;
  MakefileGenerator *this_01;
  MakefileGenerator *pMVar4;
  qsizetype qVar5;
  QTextStream *pQVar6;
  byte in_DL;
  QTextStream *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool increment;
  ProStringList *incrs;
  ProStringList *objs;
  bool src_incremental;
  QRegularExpression regexp;
  ConstIterator incrit;
  ConstIterator objit;
  ProStringList incrs_out;
  QString objectsLinkLine;
  undefined4 in_stack_fffffffffffffd98;
  WildcardConversionOption in_stack_fffffffffffffd9c;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  QString *in_stack_fffffffffffffda8;
  QStringView *in_stack_fffffffffffffdb0;
  ProStringList *in_stack_fffffffffffffdb8;
  MakefileGenerator *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdd0;
  byte in_stack_fffffffffffffdd7;
  MakefileGenerator *in_stack_fffffffffffffdd8;
  char *ch;
  int local_1fc;
  bool local_1ca;
  undefined1 local_1a0 [72];
  undefined1 local_158 [72];
  undefined1 local_110 [24];
  QRegularExpression local_f8 [64];
  QFlags_conflict *local_b8;
  undefined8 local_b0;
  const_iterator local_a8;
  const_iterator local_a0;
  QList<ProString> local_98 [5];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1ca = false;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x21aa36);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                 (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  this_00 = &QMakeProject::values
                       ((QMakeProject *)
                        CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                        (ProKey *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))->
             super_QList<ProString>;
  ProKey::~ProKey((ProKey *)0x21aa91);
  if ((in_DL & 1) == 0) {
    pQVar6 = (QTextStream *)QTextStream::operator<<(in_RSI,"OBJECTS       = ");
    MakefileGenerator::escapeDependencyPaths(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    MakefileGenerator::valList
              (in_stack_fffffffffffffdd8,
               (ProStringList *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    QTextStream::operator<<(pQVar6,(QString *)local_1a0);
    ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
    ;
    QString::~QString((QString *)0x21aff1);
    ProStringList::~ProStringList((ProStringList *)0x21affe);
  }
  else {
    ch = *(char **)(in_RDI + 0xd8);
    ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                   (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    QMakeProject::values
              ((QMakeProject *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (ProKey *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    ProKey::~ProKey((ProKey *)0x21ab07);
    local_98[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_98[0].d.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_98[0].d.size = -0x5555555555555556;
    ProStringList::ProStringList((ProStringList *)0x21ab4e);
    QTextStream::operator<<(in_RSI,"OBJECTS       = ");
    local_a0.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_a0 = QList<ProString>::begin
                         ((QList<ProString> *)
                          CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    while( true ) {
      cVar3 = QList<ProString>::end
                        ((QList<ProString> *)
                         CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
      bVar1 = QList<ProString>::const_iterator::operator!=(&local_a0,cVar3);
      if (!bVar1) break;
      bVar1 = false;
      local_a8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_a8 = QList<ProString>::begin
                           ((QList<ProString> *)
                            CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
      while( true ) {
        cVar3 = QList<ProString>::end
                          ((QList<ProString> *)
                           CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
        bVar2 = QList<ProString>::const_iterator::operator!=(&local_a8,cVar3);
        if (!bVar2) break;
        local_b0 = 0xaaaaaaaaaaaaaaaa;
        QList<ProString>::const_iterator::operator*(&local_a8);
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        QStringView::QStringView<QString,_true>(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8)
        ;
        QFlags<QRegularExpression::WildcardConversionOption>::QFlags
                  ((QFlags<QRegularExpression::WildcardConversionOption> *)
                   CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                   in_stack_fffffffffffffd9c);
        QRegularExpression::fromWildcard
                  ((QStringView *)&local_b0,(CaseSensitivity)local_f8._56_8_,local_b8);
        QString::~QString((QString *)0x21ac99);
        QList<ProString>::const_iterator::operator*(&local_a0);
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        in_stack_fffffffffffffdd7 = QString::contains(local_f8,(QRegularExpressionMatch *)&local_b0)
        ;
        QString::~QString((QString *)0x21ace0);
        if ((in_stack_fffffffffffffdd7 & 1) == 0) {
          local_1fc = 0;
        }
        else {
          bVar1 = true;
          QList<ProString>::const_iterator::operator*(&local_a0);
          QList<ProString>::append
                    ((QList<ProString> *)
                     CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                     (parameter_type)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          local_1fc = 5;
        }
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_b0);
        if (local_1fc != 0) break;
        QList<ProString>::const_iterator::operator++(&local_a8);
      }
      if (!bVar1) {
        str = (ProString *)QTextStream::operator<<(in_RSI,"\\\n\t\t");
        QList<ProString>::const_iterator::operator*(&local_a0);
        ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                     str);
      }
      QList<ProString>::const_iterator::operator++(&local_a0);
    }
    this_01 = (MakefileGenerator *)QList<ProString>::size(local_98);
    pMVar4 = (MakefileGenerator *)QList<ProString>::size(this_00);
    if (this_01 == pMVar4) {
      MakefileGenerator::escapeFilePaths(this_01,(ProStringList *)in_RSI);
      QString::QString(in_stack_fffffffffffffda8,ch);
      ProStringList::join((ProStringList *)in_RSI,(QString *)in_stack_fffffffffffffdb0);
      QTextStream::operator<<(in_RSI,(QString *)local_110);
      ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      QString::~QString((QString *)0x21ae4f);
      QString::~QString((QString *)0x21ae5c);
      ProStringList::~ProStringList((ProStringList *)0x21ae69);
    }
    else {
      qVar5 = QList<ProString>::size(local_98);
      local_1ca = qVar5 != 0;
      if (local_1ca) {
        ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                     (QTextStreamFunction)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        pQVar6 = (QTextStream *)QTextStream::operator<<(in_RSI,"INCREMENTAL_OBJECTS = ");
        MakefileGenerator::escapeFilePaths(this_01,in_stack_fffffffffffffdb8);
        QString::QString(in_stack_fffffffffffffda8,ch);
        ProStringList::join(in_stack_fffffffffffffdb8,(QString *)pQVar6);
        QTextStream::operator<<(pQVar6,(QString *)local_158);
        ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                     (QTextStreamFunction)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        QString::~QString((QString *)0x21af48);
        QString::~QString((QString *)0x21af55);
        ProStringList::~ProStringList((ProStringList *)0x21af62);
      }
      else {
        ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                     (QTextStreamFunction)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
    }
    ProStringList::~ProStringList((ProStringList *)0x21af71);
  }
  QString::~QString((QString *)0x21b01e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_1ca & 1);
}

Assistant:

bool UnixMakefileGenerator::writeObjectsPart(QTextStream &t, bool do_incremental)
{
    bool src_incremental = false;
    QString objectsLinkLine;
    const ProStringList &objs = project->values("OBJECTS");
    if (do_incremental) {
        const ProStringList &incrs = project->values("QMAKE_INCREMENTAL");
        ProStringList incrs_out;
        t << "OBJECTS       = ";
        for (ProStringList::ConstIterator objit = objs.begin(); objit != objs.end(); ++objit) {
            bool increment = false;
            for (ProStringList::ConstIterator incrit = incrs.begin(); incrit != incrs.end(); ++incrit) {
                auto regexp = QRegularExpression::fromWildcard((*incrit).toQString(), Qt::CaseSensitive,
                                                               QRegularExpression::UnanchoredWildcardConversion);
                if ((*objit).toQString().contains(regexp)) {
                    increment = true;
                    incrs_out.append((*objit));
                    break;
                }
            }
            if (!increment)
                t << "\\\n\t\t" << (*objit);
        }
        if (incrs_out.size() == objs.size()) { //we just switched places, no real incrementals to be done!
            t << escapeFilePaths(incrs_out).join(QString(" \\\n\t\t")) << Qt::endl;
        } else if (!incrs_out.size()) {
            t << Qt::endl;
        } else {
            src_incremental = true;
            t << Qt::endl;
            t << "INCREMENTAL_OBJECTS = "
              << escapeFilePaths(incrs_out).join(QString(" \\\n\t\t")) << Qt::endl;
        }
    } else {
        t << "OBJECTS       = " << valList(escapeDependencyPaths(objs)) << Qt::endl;
    }
    return src_incremental;
}